

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# numpy.h
# Opt level: O0

array_t<float,_16> __thiscall
pybind11::array_t<float,_16>::ensure(array_t<float,_16> *this,handle h)

{
  bool bVar1;
  PyObject **ppPVar2;
  PyObject *ptr;
  handle local_28;
  undefined1 local_19;
  handle local_18;
  handle h_local;
  array_t<float,_16> *result;
  
  local_19 = 0;
  local_18.m_ptr = h.m_ptr;
  h_local.m_ptr = (PyObject *)this;
  ppPVar2 = handle::ptr(&local_18);
  ptr = raw_array_t(*ppPVar2);
  handle::handle<_object_*,_0>(&local_28,ptr);
  reinterpret_steal<pybind11::array_t<float,16>>((pybind11 *)this,local_28);
  bVar1 = handle::operator_cast_to_bool((handle *)this);
  if (!bVar1) {
    PyErr_Clear();
  }
  return (array)(array)this;
}

Assistant:

static array_t ensure(handle h) {
        auto result = reinterpret_steal<array_t>(raw_array_t(h.ptr()));
        if (!result) {
            PyErr_Clear();
        }
        return result;
    }